

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FabArray(FabArray<amrex::IArrayBox> *this,Arena *a)

{
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_007d40a8;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::IArrayBox> *)0x0;
  (this->m_dallocator).m_arena = a;
  this->define_function_called = false;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hp_arrays = (void *)0x0;
  (this->m_arrays).hp = (Array4<int> *)0x0;
  (this->m_const_arrays).hp = (Array4<const_int> *)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FabArray<amrex::IArrayBox> *)0x0;
  (this->shmem).n_values = 0;
  (this->shmem).n_points = 0;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::IArrayBox>,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::IArrayBox>_*,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FBData<amrex::IArrayBox> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::IArrayBox>_*,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::IArrayBox>_*,_false>._M_head_impl =
       (PCData<amrex::IArrayBox> *)0x0;
  FabArrayBase::FabArrayStats::recordBuild((FabArrayStats *)&FabArrayBase::m_FA_stats);
  return;
}

Assistant:

FabArray<FAB>::FabArray (Arena* a) noexcept
    : m_dallocator(a),
      shmem()
{
    m_FA_stats.recordBuild();
}